

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

void __thiscall SQTable::Remove(SQTable *this,SQObjectPtr *key)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  ulong uVar4;
  _HashNode *p_Var5;
  
  SVar2 = (key->super_SQObject)._type;
  if ((int)SVar2 < 0x5000004) {
    if ((SVar2 == OT_BOOL) || (SVar2 == OT_INTEGER)) {
      uVar4 = (key->super_SQObject)._unVal.nInteger;
      goto LAB_00120ce4;
    }
  }
  else {
    if (SVar2 == OT_FLOAT) {
      uVar4 = (ulong)(key->super_SQObject)._unVal.fFloat;
      goto LAB_00120ce4;
    }
    if (SVar2 == OT_STRING) {
      uVar4 = ((key->super_SQObject)._unVal.pString)->_hash;
      goto LAB_00120ce4;
    }
  }
  uVar4 = (key->super_SQObject)._unVal.nInteger >> 3;
LAB_00120ce4:
  p_Var5 = this->_nodes + (this->_numofnodes - 1U & uVar4);
  do {
    if (((p_Var5->key).super_SQObject._unVal.pTable == (key->super_SQObject)._unVal.pTable) &&
       ((p_Var5->key).super_SQObject._type == SVar2)) goto LAB_00120d16;
    p_Var5 = p_Var5->next;
  } while (p_Var5 != (_HashNode *)0x0);
  p_Var5 = (_HashNode *)0x0;
LAB_00120d16:
  if (p_Var5 != (_HashNode *)0x0) {
    pSVar3 = (p_Var5->val).super_SQObject._unVal.pTable;
    SVar2 = (p_Var5->val).super_SQObject._type;
    (p_Var5->val).super_SQObject._type = OT_NULL;
    (p_Var5->val).super_SQObject._unVal.pTable = (SQTable *)0x0;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    pSVar3 = (p_Var5->key).super_SQObject._unVal.pTable;
    SVar2 = (p_Var5->key).super_SQObject._type;
    (p_Var5->key).super_SQObject._type = OT_NULL;
    (p_Var5->key).super_SQObject._unVal.pTable = (SQTable *)0x0;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    this->_usednodes = this->_usednodes + -1;
    Rehash(this,false);
    return;
  }
  return;
}

Assistant:

void SQTable::Remove(const SQObjectPtr &key)
{

    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        n->val.Null();
        n->key.Null();
        _usednodes--;
        Rehash(false);
    }
}